

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.cpp
# Opt level: O0

void read_filler_data_rbsp(h264_stream_t *h,bs_t *b)

{
  uint32_t uVar1;
  int ff_byte;
  bs_t *b_local;
  h264_stream_t *h_local;
  
  while( true ) {
    uVar1 = bs_next_bits(b,8);
    if (uVar1 != 0xff) break;
    bs_read_f(b,8);
  }
  read_rbsp_trailing_bits(h,b);
  return;
}

Assistant:

void read_filler_data_rbsp(h264_stream_t* h, bs_t* b)
{
    while( bs_next_bits(b, 8) == 0xFF )
    {
        int ff_byte = bs_read_f(b,8);  // equal to 0xFF
    }
    read_rbsp_trailing_bits(h, b);
}